

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O2

void __thiscall PropertyParser::parseReactProperty(PropertyParser *this,string *reactType)

{
  int type;
  bool bVar1;
  undefined1 local_68 [8];
  string name;
  allocator local_21;
  
  std::__cxx11::string::string
            ((string *)local_68,
             (string *)
             ((this->tokens).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1));
  std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),"BULK",&local_21);
  bVar1 = Utilities::match(reactType,(string *)((long)&name.field_2 + 8));
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  if (bVar1) {
    type = 3;
  }
  else {
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),"WALL",&local_21);
    bVar1 = Utilities::match(reactType,(string *)((long)&name.field_2 + 8));
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    if (!bVar1) {
      std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),"TANK",&local_21);
      bVar1 = Utilities::match(reactType,(string *)((long)&name.field_2 + 8));
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      if (bVar1) {
        parseNodeProperty(this,0x13,(string *)local_68);
      }
      else {
        OptionParser::parseReactOption
                  (&this->optionParser,(this->super_InputParser).network,&this->tokens);
      }
      goto LAB_00132130;
    }
    type = 4;
  }
  parseLinkProperty(this,type,(string *)local_68);
LAB_00132130:
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void PropertyParser::parseReactProperty(string& reactType)
{
    string name = tokens[1];
    if ( Utilities::match(reactType, w_Bulk) )
    {
        parseLinkProperty(BULK, name);
    }
    else if ( Utilities::match(reactType, w_Wall) )
    {
        parseLinkProperty(WALL, name);
    }
    else if ( Utilities::match(reactType, w_Tank) )
    {
        parseNodeProperty(InputReader::REACTION, name);
    }
    else optionParser.parseReactOption(network, tokens);
}